

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O0

DecoderResult * ZXing::DataMatrix::Decode(BitMatrix *bits)

{
  bool bVar1;
  DecoderResult *in_RDI;
  DecoderResult res;
  DecoderResult *mirroredRes;
  BitMatrix *in_stack_000001b8;
  DecoderResult *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  DecoderResult *this;
  bool local_119 [33];
  uint7 in_stack_ffffffffffffff08;
  byte bVar2;
  
  this = in_RDI;
  DoDecode(in_stack_000001b8);
  bVar1 = DecoderResult::isValid(this,SUB81((ulong)in_RDI >> 0x38,0));
  if (bVar1) {
    DecoderResult::DecoderResult
              ((DecoderResult *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
  }
  else {
    bVar2 = 0;
    FlippedL((BitMatrix *)(ulong)in_stack_ffffffffffffff08);
    DoDecode(in_stack_000001b8);
    BitMatrix::~BitMatrix((BitMatrix *)0x26bc2a);
    bVar1 = DecoderResult::isValid(this,SUB81((ulong)in_RDI >> 0x38,0));
    in_stack_fffffffffffffec7 = bVar1;
    if (bVar1) {
      local_119[0] = true;
      DecoderResult::setIsMirrored(in_RDI,local_119);
      bVar2 = 1;
    }
    if ((bVar2 & 1) == 0) {
      DecoderResult::~DecoderResult
                ((DecoderResult *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    }
    if (!bVar1) {
      DecoderResult::DecoderResult
                ((DecoderResult *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
    }
  }
  DecoderResult::~DecoderResult
            ((DecoderResult *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  return this;
}

Assistant:

DecoderResult Decode(const BitMatrix& bits)
{
	auto res = DoDecode(bits);
	if (res.isValid())
		return res;

	//TODO:
	// * unify bit mirroring helper code with QRReader?
	// * rectangular symbols with the a size of 8 x Y are not supported a.t.m.
	if (auto mirroredRes = DoDecode(FlippedL(bits)); mirroredRes.isValid()) {
		mirroredRes.setIsMirrored(true);
		return mirroredRes;
	}

	return res;
}